

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int check_policy(X509_STORE_CTX *ctx)

{
  int iVar1;
  uint in_R8D;
  stack_st_DIST_POINT *psStack_20;
  int ret;
  X509 *current_cert;
  X509_STORE_CTX *ctx_local;
  
  psStack_20 = (stack_st_DIST_POINT *)0x0;
  current_cert = (X509 *)ctx;
  iVar1 = X509_policy_check((X509_POLICY_TREE **)ctx->chain,(int *)ctx->param->policies,
                            (stack_st_X509 *)ctx->param->flags,
                            (stack_st_ASN1_OBJECT *)&stack0xffffffffffffffe0,in_R8D);
  if (iVar1 == 0) {
    ctx_local._4_4_ = 1;
  }
  else {
    current_cert->crldp = psStack_20;
    *(int *)((long)&current_cert->akid + 4) = iVar1;
    if (iVar1 == 0x11) {
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = call_verify_cb(0,(X509_STORE_CTX *)current_cert);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int check_policy(X509_STORE_CTX *ctx) {
  X509 *current_cert = NULL;
  int ret = X509_policy_check(ctx->chain, ctx->param->policies,
                              ctx->param->flags, &current_cert);
  if (ret != X509_V_OK) {
    ctx->current_cert = current_cert;
    ctx->error = ret;
    if (ret == X509_V_ERR_OUT_OF_MEM) {
      return 0;
    }
    return call_verify_cb(0, ctx);
  }

  return 1;
}